

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFreeContext(xmlXPathContextPtr ctxt)

{
  if (ctxt != (xmlXPathContextPtr)0x0) {
    if ((xmlXPathContextCachePtr)ctxt->cache != (xmlXPathContextCachePtr)0x0) {
      xmlXPathFreeCache((xmlXPathContextCachePtr)ctxt->cache);
    }
    xmlHashFree(ctxt->nsHash,xmlHashDefaultDeallocator);
    ctxt->nsHash = (xmlHashTablePtr)0x0;
    xmlHashFree(ctxt->funcHash,(xmlHashDeallocator)0x0);
    ctxt->funcHash = (xmlHashTablePtr)0x0;
    xmlHashFree(ctxt->varHash,xmlXPathFreeObjectEntry);
    ctxt->varHash = (xmlHashTablePtr)0x0;
    xmlResetError(&ctxt->lastError);
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlXPathFreeContext(xmlXPathContextPtr ctxt) {
    if (ctxt == NULL) return;

    if (ctxt->cache != NULL)
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
    xmlXPathRegisteredNsCleanup(ctxt);
    xmlXPathRegisteredFuncsCleanup(ctxt);
    xmlXPathRegisteredVariablesCleanup(ctxt);
    xmlResetError(&ctxt->lastError);
    xmlFree(ctxt);
}